

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O3

int catenate(Global *global,ReturnCode *ret)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  uint c_00;
  ReturnCode RVar4;
  char *__src;
  size_t sVar5;
  size_t sVar6;
  ushort **ppuVar7;
  int c;
  uint local_34;
  
  iVar3 = get(global);
  if (iVar3 == 0x1e) {
    __src = savestring(global,global->tokenbuf);
    c_00 = get(global);
    local_34 = c_00;
    if (global->rightconcat == '\0') {
      lookid(global,c_00);
    }
    else {
      RVar4 = macroid(global,(int *)&local_34);
      *ret = RVar4;
      c_00 = local_34;
      if (RVar4 != FPP_OK) goto LAB_00106100;
    }
    cVar1 = type[(int)c_00];
    if ((cVar1 == '\x01') || (cVar1 == 'B')) {
      strcpy(global->work,__src);
      sVar5 = strlen(global->work);
      global->workp = global->work + sVar5;
      RVar4 = scannumber(global,c_00,save);
      *ret = RVar4;
      if (RVar4 != FPP_OK) goto LAB_00106100;
      pcVar2 = global->workp;
      if (global->work + 0x200 <= pcVar2) {
        cerror(global,FATAL_WORK_BUFFER_OVERFLOW);
        goto LAB_00106270;
      }
      global->workp = pcVar2 + 1;
      *pcVar2 = '\0';
      *ret = FPP_OK;
    }
    else if (cVar1 == '\x02') {
      sVar5 = strlen(__src);
      pcVar2 = global->tokenbuf;
      sVar6 = strlen(pcVar2);
      if (0x1ff < (int)sVar6 + (int)sVar5) {
        cerror(global,FATAL_WORK_AREA_OVERFLOW,__src);
LAB_00106270:
        *ret = FPP_WORK_AREA_OVERFLOW;
        return 0;
      }
      sprintf(global->work,"%s%s",__src,pcVar2);
    }
    else {
      ppuVar7 = __ctype_b_loc();
      cerror(global,ERROR_STRANG_CHARACTER2 - (((*ppuVar7)[(int)c_00] >> 0xe & 1) != 0),(ulong)c_00)
      ;
      strcpy(global->work,__src);
      unget(global);
    }
    Free(__src);
    RVar4 = ungetstring(global,global->work);
    *ret = RVar4;
    RVar4 = RVar4 ^ FPP_OUT_OF_MEMORY;
  }
  else {
    unget(global);
LAB_00106100:
    RVar4 = FPP_OK;
  }
  return RVar4;
}

Assistant:

int catenate(struct Global *global, ReturnCode *ret)
{
  /*
   * A token was just read (via macroid).
   * If the next character is TOK_SEP, concatenate the next token
   * return TRUE -- which should recall macroid after refreshing
   * macroid's argument.  If it is not TOK_SEP, unget() the character
   * and return FALSE.
   */

#if OK_CONCAT
  int c;
  char *token1;
#endif
  
#if OK_CONCAT
  if (get(global) != TOK_SEP) {                 /* Token concatenation  */
    unget(global);
    return (FALSE);
  }
  else {
    token1 = savestring(global, global->tokenbuf); /* Save first token     */
    c=get(global);
    if(global->rightconcat) {
      *ret=macroid(global, &c);           /* Scan next token      */
      if(*ret)
	return(FALSE);
    } else
      lookid(global, c);
    switch(type[c]) {                   /* What was it?         */
    case LET:				/* An identifier, ...	*/
      if ((int)strlen(token1) + (int)strlen(global->tokenbuf) >= NWORK) {
	cfatal(global, FATAL_WORK_AREA_OVERFLOW, token1);
	*ret=FPP_WORK_AREA_OVERFLOW;
	return(FALSE);
      }
      sprintf(global->work, "%s%s", token1, global->tokenbuf);
      break;
    case DIG:				/* A number		*/
    case DOT:				/* Or maybe a float	*/
      strcpy(global->work, token1);
      global->workp = global->work + strlen(global->work);
      *ret=scannumber(global, c, save);
      if(*ret)
	return(FALSE);
      *ret=save(global, EOS);
      if(*ret)
	return(FALSE);
      break;
    default:				/* An error, ...	*/
      if (isprint(c))
	cerror(global, ERROR_STRANG_CHARACTER, c);
      else
	cerror(global, ERROR_STRANG_CHARACTER2, c);
      strcpy(global->work, token1);
      unget(global);
      break;
    }
    /*
     * work has the concatenated token and token1 has
     * the first token (no longer needed).  Unget the
     * new (concatenated) token after freeing token1.
     * Finally, setup to read the new token.
     */
    Freemem(token1);                        /* Free up memory       */
    *ret=ungetstring(global, global->work);  /* Unget the new thing, */
    if(*ret)
      return(FALSE);
    return(TRUE);
  }
#else
  return(FALSE);                    /* Not supported        */
#endif
}